

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.c
# Opt level: O1

void creatHuffmanCode(HuffmanTree *huffmanTree,HuffmanCode *huffmanCode,int n)

{
  HuffmanTree paVar1;
  void *pvVar2;
  void *__ptr;
  byte *pbVar3;
  char *__dest;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  size_t __size;
  ulong uVar9;
  
  __size = (size_t)n;
  pvVar2 = malloc(__size * 8 + 8);
  __ptr = malloc(__size);
  *(undefined1 *)((long)__ptr + (__size - 1)) = 0;
  if (0 < n) {
    paVar1 = *huffmanTree;
    uVar6 = 1;
    do {
      uVar4 = paVar1[uVar6].parent;
      uVar8 = (uint)(__size - 1);
      if (uVar4 != 0) {
        uVar5 = uVar6 & 0xffffffff;
        uVar9 = __size - 1 & 0xffffffff;
        pbVar3 = (byte *)((long)(n + -2) + (long)__ptr);
        do {
          uVar8 = (int)uVar9 - 1;
          uVar9 = (ulong)uVar8;
          *pbVar3 = paVar1[(int)uVar4].lchild == (uint)uVar5 ^ 0x31;
          uVar5 = (ulong)uVar4;
          uVar4 = huffmanTree[(int)uVar4]->parent;
          pbVar3 = pbVar3 + -1;
        } while (uVar4 != 0);
      }
      __dest = (char *)malloc((long)(int)(n - uVar8));
      *(char **)((long)pvVar2 + uVar6 * 8) = __dest;
      strcpy(__dest,(char *)((long)(int)uVar8 + (long)__ptr));
      uVar6 = uVar6 + 1;
    } while (uVar6 != n + 1);
  }
  free(__ptr);
  if (0 < n) {
    lVar7 = 8;
    do {
      printf("Huffmancode of %3d is %s\n",
             (ulong)*(uint *)((long)&(*huffmanTree)->weight + lVar7 * 2),
             *(undefined8 *)((long)pvVar2 + lVar7));
      lVar7 = lVar7 + 8;
    } while ((ulong)(uint)n * 8 + 8 != lVar7);
  }
  putchar(10);
  return;
}

Assistant:

void creatHuffmanCode(HuffmanTree *huffmanTree,HuffmanCode *huffmanCode,int n){
    //指示标记
    int i;
    //编码的起始指针
    int start;
    //编码的起始的父节点
    int p;
    //遍历n个叶子结点的指示标记c
    unsigned int c;
    //分配n个编码的头指针
    huffmanCode = (HuffmanCode *)malloc((n + 1) * sizeof(char *));
    //分配求当前编码的工作空间
    char *cd = (char *)malloc(n * sizeof(char));
    //从右向左逐位存放编码，首先存放编码结束符
    cd[n - 1] = '\0';
    //求n个叶子结点对应的哈夫曼编码
    for (i = 1;i <= n;i++){
        //初始化编码起始指针
        start = n - 1;
        //从叶子到根结点求编码
        for (c = i,p =  (*huffmanTree)[i].parent;p != 0; c = p, p = (*huffmanTree[p]).parent) {
            if ((*huffmanTree)[p].lchild == c) {
                //从右到左的顺序编码入数组内
                cd[--start] = '0';  //左分支标0
            } else {
                cd[--start] = '1';  //右分支标1
            }

        }//为第i个编码分配空间
            huffmanCode[i] = (char *)malloc((n - start) * sizeof(char));

            strcpy(huffmanCode[i],&cd[start]);
    }

        free(cd);
        //打印编码序列
        for(i = 1;i <= n;i++){
            printf("Huffmancode of %3d is %s\n",(*huffmanTree)[i].weight,huffmanCode[i]);
        }

    printf("\n");
}